

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_proxy_has(JSContext *ctx,JSValue obj,JSAtom atom)

{
  void *pvVar1;
  JSValue val;
  JSValue this_obj;
  JSValue func_obj;
  JSValue obj_00;
  JSValue v;
  int iVar2;
  uint uVar3;
  JSProxyData *pJVar4;
  JSContext *in_RDI;
  JSValue JVar5;
  JSPropertyDescriptor desc;
  JSContext *in_stack_00000058;
  BOOL res2;
  JSValue args [2];
  JSObject *p;
  int res;
  int ret;
  JSValue atom_val;
  JSValue ret1;
  JSValue method;
  JSProxyData *s;
  undefined8 in_stack_fffffffffffffee8;
  JSAtom atom_00;
  JSPropertyDescriptor *desc_00;
  JSContext *in_stack_fffffffffffffef0;
  JSValue in_stack_fffffffffffffef8;
  uint local_f8;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  JSValueUnion in_stack_ffffffffffffff20;
  JSValueUnion in_stack_ffffffffffffff28;
  int64_t in_stack_ffffffffffffff30;
  JSValueUnion in_stack_ffffffffffffff38;
  int64_t in_stack_ffffffffffffff40;
  JSAtom in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff50 [16];
  undefined4 in_stack_ffffffffffffff60;
  JSAtom in_stack_ffffffffffffff64;
  JSContext *in_stack_ffffffffffffff68;
  JSValueUnion in_stack_ffffffffffffff70;
  int64_t in_stack_ffffffffffffff78;
  JSValueUnion in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffc8;
  int local_4;
  
  atom_00 = (JSAtom)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  JVar5.u._4_4_ = in_stack_ffffffffffffff64;
  JVar5.u.int32 = in_stack_ffffffffffffff60;
  JVar5.tag = (int64_t)in_stack_ffffffffffffff68;
  pJVar4 = get_proxy_method(in_stack_ffffffffffffff50._8_8_,in_stack_ffffffffffffff50._0_8_,JVar5,
                            in_stack_ffffffffffffff4c);
  if (pJVar4 == (JSProxyData *)0x0) {
    local_4 = -1;
  }
  else {
    v.tag = in_stack_ffffffffffffffc8;
    v.u.float64 = in_stack_ffffffffffffffc0.float64;
    iVar2 = JS_IsUndefined(v);
    if (iVar2 == 0) {
      JVar5 = JS_AtomToValue(in_stack_fffffffffffffef0,atom_00);
      iVar2 = JS_IsException(JVar5);
      if (iVar2 == 0) {
        desc_00 = (JSPropertyDescriptor *)&stack0xffffffffffffff68;
        func_obj.tag = in_stack_ffffffffffffff40;
        func_obj.u.float64 = in_stack_ffffffffffffff38.float64;
        this_obj.tag = in_stack_ffffffffffffff30;
        this_obj.u.ptr = in_stack_ffffffffffffff28.ptr;
        JVar5 = JS_CallFree((JSContext *)in_stack_ffffffffffffff20.ptr,func_obj,this_obj,
                            in_stack_ffffffffffffff1c,
                            (JSValue *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                           );
        JS_FreeValue(in_stack_fffffffffffffef0,in_stack_fffffffffffffef8);
        iVar2 = JS_IsException(JVar5);
        if (iVar2 == 0) {
          val.tag = (int64_t)in_stack_ffffffffffffff28.ptr;
          val.u.ptr = in_stack_ffffffffffffff20.ptr;
          local_4 = JS_ToBoolFree((JSContext *)
                                  CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),val)
          ;
          if (local_4 == 0) {
            pvVar1 = (pJVar4->target).u.ptr;
            iVar2 = JS_GetOwnPropertyInternal
                              (in_stack_00000058,(JSPropertyDescriptor *)desc.setter.tag,
                               (JSObject *)desc.setter.u.ptr,desc.getter.tag._4_4_);
            if (iVar2 < 0) {
              local_4 = -1;
            }
            else if (iVar2 != 0) {
              uVar3 = (uint)(((local_f8 & 1) != 0 ^ 0xffU) & 1);
              js_free_desc(in_stack_fffffffffffffef0,desc_00);
              if ((uVar3 != 0) || ((*(byte *)((long)pvVar1 + 5) & 1) == 0)) {
                JS_ThrowTypeError(in_RDI,"proxy: inconsistent has");
                local_4 = -1;
              }
            }
          }
        }
        else {
          local_4 = -1;
        }
      }
      else {
        JS_FreeValue(in_stack_fffffffffffffef0,in_stack_fffffffffffffef8);
        local_4 = -1;
      }
    }
    else {
      obj_00.tag = in_stack_ffffffffffffff78;
      obj_00.u.float64 = in_stack_ffffffffffffff70.float64;
      local_4 = JS_HasProperty(in_stack_ffffffffffffff68,obj_00,in_stack_ffffffffffffff64);
    }
  }
  return local_4;
}

Assistant:

static int js_proxy_has(JSContext *ctx, JSValueConst obj, JSAtom atom)
{
    JSProxyData *s;
    JSValue method, ret1, atom_val;
    int ret, res;
    JSObject *p;
    JSValueConst args[2];
    BOOL res2;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_has);
    if (!s)
        return -1;
    if (JS_IsUndefined(method))
        return JS_HasProperty(ctx, s->target, atom);
    atom_val = JS_AtomToValue(ctx, atom);
    if (JS_IsException(atom_val)) {
        JS_FreeValue(ctx, method);
        return -1;
    }
    args[0] = s->target;
    args[1] = atom_val;
    ret1 = JS_CallFree(ctx, method, s->handler, 2, args);
    JS_FreeValue(ctx, atom_val);
    if (JS_IsException(ret1))
        return -1;
    ret = JS_ToBoolFree(ctx, ret1);
    if (!ret) {
        JSPropertyDescriptor desc;
        p = JS_VALUE_GET_OBJ(s->target);
        res = JS_GetOwnPropertyInternal(ctx, &desc, p, atom);
        if (res < 0)
            return -1;
        if (res) {
            res2 = !(desc.flags & JS_PROP_CONFIGURABLE);
            js_free_desc(ctx, &desc);
            if (res2 || !p->extensible) {
                JS_ThrowTypeError(ctx, "proxy: inconsistent has");
                return -1;
            }
        }
    }
    return ret;
}